

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvas.cpp
# Opt level: O0

void NULLCCanvas::CanvasDrawRect(int x1,int y1,int x2,int y2,Canvas *ptr)

{
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_2c;
  int ye;
  int y;
  int xe;
  int x;
  Canvas *ptr_local;
  int y2_local;
  int x2_local;
  int y1_local;
  int x1_local;
  
  if (ptr == (Canvas *)0x0) {
    nullcThrowError("ERROR: Canvas object is nullptr");
  }
  else {
    local_34 = x1;
    if (x1 < 0) {
      local_34 = 0;
    }
    y = local_34;
    local_38 = x2;
    if (ptr->width < x2) {
      local_38 = ptr->width;
    }
    for (; y < local_38; y = y + 1) {
      local_3c = y1;
      if (y1 < 0) {
        local_3c = 0;
      }
      local_2c = local_3c;
      local_40 = y2;
      if (ptr->height < y2) {
        local_40 = ptr->height;
      }
      for (; local_2c < local_40; local_2c = local_2c + 1) {
        *(float *)((ptr->data).ptr + (long)((local_2c * ptr->width + y) * 4) * 4) = ptr->color[0];
        *(float *)((ptr->data).ptr + (long)((local_2c * ptr->width + y) * 4 + 1) * 4) =
             ptr->color[1];
        *(float *)((ptr->data).ptr + (long)((local_2c * ptr->width + y) * 4 + 2) * 4) =
             ptr->color[2];
        *(float *)((ptr->data).ptr + (long)((local_2c * ptr->width + y) * 4 + 3) * 4) =
             ptr->color[3];
      }
    }
  }
  return;
}

Assistant:

void CanvasDrawRect(int x1, int y1, int x2, int y2, Canvas* ptr)
	{
		if(!ptr)
		{
			nullcThrowError("ERROR: Canvas object is nullptr");
			return;
		}
		for(int x = x1 < 0 ? 0 : x1, xe = x2 > ptr->width ? ptr->width : x2; x < xe; x++)
		{
			for(int y = y1 < 0 ? 0 : y1, ye = y2 > ptr->height ? ptr->height : y2; y < ye; y++)
			{
				((float*)ptr->data.ptr)[(y*ptr->width + x) * 4 + 0] = ptr->color[0];
				((float*)ptr->data.ptr)[(y*ptr->width + x) * 4 + 1] = ptr->color[1];
				((float*)ptr->data.ptr)[(y*ptr->width + x) * 4 + 2] = ptr->color[2];
				((float*)ptr->data.ptr)[(y*ptr->width + x) * 4 + 3] = ptr->color[3];
			}
		}
	}